

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
          (DrawIndirectBase *this,GLboolean mapped,GLbitfield access,GLbitfield accessFlag,
          GLintptr offset,GLsizeiptr length)

{
  long lVar1;
  GLboolean value;
  GLboolean extraout_DL;
  GLboolean extraout_DL_00;
  GLboolean extraout_DL_01;
  GLboolean value_00;
  GLbitfield access_00;
  GLbitfield extraout_EDX;
  GLbitfield extraout_EDX_00;
  GLbitfield extraout_EDX_01;
  GLbitfield access_01;
  undefined7 in_register_00000031;
  CallLogWrapper *this_00;
  int v;
  DIResult result;
  uint local_380;
  uint local_37c;
  string local_378;
  string local_358;
  undefined1 local_338 [8];
  ostream local_330;
  undefined1 local_1b8 [384];
  long local_38;
  
  local_37c = (uint)CONCAT71(in_register_00000031,mapped);
  local_1b8[0] = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
  local_38 = 0;
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x88bb,(GLint *)&local_380);
  if (local_380 != access) {
    local_38 = -1;
    local_338[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_338,
               (char (*) [68])"glGetBufferParameteriv(GL_BUFFER_ACCESS) returned incorrect state: ")
    ;
    glcts::(anonymous_namespace)::DrawIndirectBase::AccessToString_abi_cxx11_
              (&local_358,(DrawIndirectBase *)(ulong)local_380,access_00);
    access_01 = extraout_EDX;
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_330,local_358._M_dataplus._M_p,local_358._M_string_length);
      access_01 = extraout_EDX_00;
    }
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(&local_330,", expected: ",0xc);
      access_01 = extraout_EDX_01;
    }
    glcts::(anonymous_namespace)::DrawIndirectBase::AccessToString_abi_cxx11_
              (&local_378,(DrawIndirectBase *)(ulong)access,access_01);
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_330,local_378._M_dataplus._M_p,local_378._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    DILogger::~DILogger((DILogger *)local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x911f,(GLint *)&local_380);
  if (local_380 != accessFlag) {
    local_38 = -1;
    local_338[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_338,
               (char (*) [74])
               "glGetBufferParameteriv(GL_BUFFER_ACCESS_FLAGS) returned incorrect state: ");
    if (local_338[0] == (DILogger)0x0) {
      std::ostream::operator<<(&local_330,local_380);
    }
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(&local_330,", expected: ",0xc);
    }
    if (local_338[0] == (DILogger)0x0) {
      std::ostream::_M_insert<unsigned_long>((ulong)&local_330);
    }
    DILogger::~DILogger((DILogger *)local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x88bc,(GLint *)&local_380);
  if (local_380 != (local_37c & 0xff)) {
    local_38 = -1;
    local_338[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_338,
               (char (*) [68])"glGetBufferParameteriv(GL_BUFFER_MAPPED) returned incorrect state: ")
    ;
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_358,(DrawIndirectBase *)(ulong)(byte)local_380,value);
    value_00 = extraout_DL;
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_330,local_358._M_dataplus._M_p,local_358._M_string_length);
      value_00 = extraout_DL_00;
    }
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(&local_330,", expected: ",0xc);
      value_00 = extraout_DL_01;
    }
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_378,(DrawIndirectBase *)(ulong)(access & 0xff),value_00);
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_330,local_378._M_dataplus._M_p,local_378._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    DILogger::~DILogger((DILogger *)local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x9121,(GLint *)&local_380);
  if ((int)local_380 != offset) {
    local_38 = -1;
    local_338[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_338,
               (char (*) [73])
               "glGetBufferParameteriv(GL_BUFFER_MAP_OFFSET) returned incorrect offset: ");
    if (local_338[0] == (DILogger)0x0) {
      std::ostream::operator<<(&local_330,local_380);
    }
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(&local_330,", expected: ",0xc);
    }
    if (local_338[0] == (DILogger)0x0) {
      std::ostream::_M_insert<long>((long)&local_330);
    }
    DILogger::~DILogger((DILogger *)local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x9120,(GLint *)&local_380);
  if ((int)local_380 != length) {
    local_38 = -1;
    local_338[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_338,
               (char (*) [73])
               "glGetBufferParameteriv(GL_BUFFER_MAP_LENGTH) returned incorrect length: ");
    if (local_338[0] == (DILogger)0x0) {
      std::ostream::operator<<(&local_330,local_380);
    }
    if (local_338[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(&local_330,", expected: ",0xc);
    }
    if (local_338[0] == (DILogger)0x0) {
      std::ostream::_M_insert<long>((long)&local_330);
    }
    DILogger::~DILogger((DILogger *)local_338);
  }
  lVar1 = local_38;
  DILogger::~DILogger((DILogger *)local_1b8);
  return lVar1;
}

Assistant:

long StateValidate(GLboolean mapped, GLbitfield access, GLbitfield accessFlag, GLintptr offset, GLsizeiptr length)
	{
		DIResult result;

		if (!api::isES())
		{
			int v;
			glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_ACCESS, &v);
			if (v != static_cast<int>(access))
			{
				result.error() << "glGetBufferParameteriv(GL_BUFFER_ACCESS) returned incorrect state: "
							   << AccessToString(v) << ", expected: " << AccessToString(access);
			}
		}

		int v;
		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_ACCESS_FLAGS, &v);
		if (v != static_cast<int>(accessFlag))
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_ACCESS_FLAGS) returned incorrect state: " << v
						   << ", expected: " << accessFlag;
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAPPED, &v);
		if (v != mapped)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAPPED) returned incorrect state: "
						   << BoolToString((GLboolean)v) << ", expected: " << BoolToString((GLboolean)access);
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_OFFSET, &v);
		if (v != offset)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAP_OFFSET) returned incorrect offset: " << v
						   << ", expected: " << offset;
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_LENGTH, &v);
		if (v != length)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAP_LENGTH) returned incorrect length: " << v
						   << ", expected: " << length;
		}

		return result.code();
	}